

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

void Abc_NtkTestMiniMapping(Abc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  
  p_00 = Abc_NtkWriteMiniMapping(p);
  Abc_NtkPrintMiniMapping(p_00->pArray);
  printf("Array has size %d ints.\n",(ulong)(uint)p_00->nSize);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Abc_NtkTestMiniMapping( Abc_Ntk_t * p )
{
    Vec_Int_t * vMapping;
    vMapping = Abc_NtkWriteMiniMapping( p );
    Abc_NtkPrintMiniMapping( Vec_IntArray(vMapping) );
    printf( "Array has size %d ints.\n", Vec_IntSize(vMapping) );
    Vec_IntFree( vMapping );
}